

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_glnodes.cpp
# Opt level: O2

bool LoadNodes(FileReader *lump)

{
  undefined8 uVar1;
  ushort uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  undefined8 *puVar8;
  node_t *pnVar9;
  undefined8 *puVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  undefined1 *__s;
  anon_union_32_2_9298864e_for_node_t_4 *paVar14;
  undefined8 *puVar15;
  long lVar16;
  bool bVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined8 uStack_50;
  short asStack_48 [4];
  anon_union_32_2_9298864e_for_node_t_4 *local_40;
  undefined8 *local_38;
  
  if (format5 == '\0') {
    numnodes = (int)((ulong)lump->Length / 0x1c);
    if (numnodes == 0) {
      return false;
    }
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (long)numnodes;
    uVar18 = SUB168(auVar4 * ZEXT816(0x48),0);
    if (SUB168(auVar4 * ZEXT816(0x48),8) != 0) {
      uVar18 = 0xffffffffffffffff;
    }
    uStack_50 = 0x40656d;
    nodes = (node_t *)operator_new__(uVar18);
    iVar11 = 0;
    uStack_50 = 0x406586;
    (*(lump->super_FileReaderBase)._vptr_FileReaderBase[4])(lump,0,0);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (long)numnodes;
    uVar18 = 0xffffffffffffffff;
    if (SUB168(auVar5 * ZEXT816(0x1c),8) == 0) {
      uVar18 = SUB168(auVar5 * ZEXT816(0x1c),0);
    }
    uStack_50 = 0x406599;
    puVar8 = (undefined8 *)operator_new__(uVar18);
    uStack_50 = 0x4065ac;
    (*(lump->super_FileReaderBase)._vptr_FileReaderBase[2])(lump,puVar8,lump->Length);
    uVar18 = (ulong)numnodes;
    lVar16 = -(uVar18 * 2 + 0xf & 0xfffffffffffffff0);
    __s = (undefined1 *)((long)asStack_48 + lVar16);
    *(undefined8 *)((long)asStack_48 + lVar16 + -8) = 0x4065d5;
    memset(__s,0,uVar18 * 2);
    puVar10 = puVar8 + 1;
    paVar14 = &nodes->field_4;
    local_38 = puVar8;
    pnVar9 = nodes;
    for (; iVar11 < (int)uVar18; iVar11 = iVar11 + 1) {
      uVar1 = *puVar8;
      auVar7._10_2_ = (short)((ulong)uVar1 >> 0x20);
      auVar7._0_10_ = (unkuint10)0;
      auVar20._2_12_ =
           SUB1612(ZEXT616(CONCAT42(auVar7._8_4_,(short)((ulong)uVar1 >> 0x10))) << 0x30,4);
      auVar20._0_2_ = (short)uVar1;
      auVar20._14_2_ = 0;
      auVar20 = auVar20 << 0x10;
      pnVar9->x = auVar20._0_4_;
      pnVar9->y = auVar20._4_4_;
      pnVar9->dx = auVar20._8_4_;
      pnVar9->dy = auVar20._12_4_;
      local_40 = paVar14;
      puVar15 = puVar10;
      for (lVar16 = 0; lVar16 != 2; lVar16 = lVar16 + 1) {
        uVar2 = *(ushort *)((long)puVar8 + lVar16 * 2 + 0x18);
        uVar12 = (uint)uVar2;
        if ((short)uVar2 < 0) {
          if (numsubsectors <= (int)(uVar12 & 0x7fff)) goto LAB_004066dd;
          *(undefined1 **)((long)&pnVar9->field_6 + lVar16 * 8) =
               (undefined1 *)((long)&subsectors[uVar12 & 0x7fff].sector + 1);
        }
        else {
          if ((numnodes <= (int)uVar12) ||
             (uVar18 = (ulong)uVar12, *(short *)(__s + uVar18 * 2) != 0)) goto LAB_004066dd;
          *(node_t **)((long)&pnVar9->field_6 + lVar16 * 8) = nodes + uVar18;
          *(short *)(__s + uVar18 * 2) = (short)lVar16 + 1;
        }
        for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
          *(float *)((long)paVar14 + lVar13 * 4) =
               (float)(int)*(short *)((long)puVar15 + lVar13 * 2);
        }
        puVar15 = puVar15 + 1;
        paVar14 = (anon_union_32_2_9298864e_for_node_t_4 *)((long)paVar14 + 0x10);
      }
      pnVar9 = pnVar9 + 1;
      puVar8 = (undefined8 *)((long)puVar8 + 0x1c);
      uVar18 = (ulong)(uint)numnodes;
      puVar10 = (undefined8 *)((long)puVar10 + 0x1c);
      paVar14 = (anon_union_32_2_9298864e_for_node_t_4 *)((long)local_40 + 0x48);
    }
  }
  else {
    numnodes = (int)((ulong)lump->Length >> 5);
    if (numnodes == 0) {
      return false;
    }
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)numnodes;
    uVar18 = SUB168(auVar3 * ZEXT816(0x48),0);
    if (SUB168(auVar3 * ZEXT816(0x48),8) != 0) {
      uVar18 = 0xffffffffffffffff;
    }
    uStack_50 = 0x4063c2;
    nodes = (node_t *)operator_new__(uVar18);
    iVar11 = 0;
    uStack_50 = 0x4063db;
    (*(lump->super_FileReaderBase)._vptr_FileReaderBase[4])(lump,0,0);
    uVar18 = (long)numnodes << 5;
    if ((long)numnodes < 0) {
      uVar18 = 0xffffffffffffffff;
    }
    uStack_50 = 0x4063f2;
    puVar8 = (undefined8 *)operator_new__(uVar18);
    uStack_50 = 0x406405;
    (*(lump->super_FileReaderBase)._vptr_FileReaderBase[2])(lump,puVar8,lump->Length);
    uVar18 = (ulong)numnodes;
    lVar16 = -(uVar18 * 2 + 0xf & 0xfffffffffffffff0);
    __s = (undefined1 *)((long)asStack_48 + lVar16);
    *(undefined8 *)((long)asStack_48 + lVar16 + -8) = 0x40642e;
    memset(__s,0,uVar18 * 2);
    puVar10 = puVar8 + 1;
    paVar14 = &nodes->field_4;
    local_38 = puVar8;
    pnVar9 = nodes;
    for (; iVar11 < (int)uVar18; iVar11 = iVar11 + 1) {
      uVar1 = *puVar8;
      auVar6._10_2_ = (short)((ulong)uVar1 >> 0x20);
      auVar6._0_10_ = (unkuint10)0;
      auVar19._2_12_ =
           SUB1612(ZEXT616(CONCAT42(auVar6._8_4_,(short)((ulong)uVar1 >> 0x10))) << 0x30,4);
      auVar19._0_2_ = (short)uVar1;
      auVar19._14_2_ = 0;
      auVar19 = auVar19 << 0x10;
      pnVar9->x = auVar19._0_4_;
      pnVar9->y = auVar19._4_4_;
      pnVar9->dx = auVar19._8_4_;
      pnVar9->dy = auVar19._12_4_;
      local_40 = paVar14;
      puVar15 = puVar10;
      for (lVar16 = 0; lVar16 != 2; lVar16 = lVar16 + 1) {
        uVar12 = *(uint *)((long)puVar8 + lVar16 * 4 + 0x18);
        uVar18 = (ulong)uVar12;
        if ((int)uVar12 < 0) {
          if (numsubsectors <= (int)(uVar12 & 0x7fffffff)) goto LAB_004066dd;
          *(undefined1 **)((long)&pnVar9->field_6 + lVar16 * 8) =
               (undefined1 *)((long)&subsectors[uVar12 & 0x7fffffff].sector + 1);
        }
        else {
          if ((numnodes <= (int)uVar12) || (*(short *)(__s + uVar18 * 2) != 0)) goto LAB_004066dd;
          *(node_t **)((long)&pnVar9->field_6 + lVar16 * 8) = nodes + uVar18;
          *(short *)(__s + uVar18 * 2) = (short)lVar16 + 1;
        }
        for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
          *(float *)((long)paVar14 + lVar13 * 4) =
               (float)(int)*(short *)((long)puVar15 + lVar13 * 2);
        }
        puVar15 = puVar15 + 1;
        paVar14 = (anon_union_32_2_9298864e_for_node_t_4 *)((long)paVar14 + 0x10);
      }
      pnVar9 = pnVar9 + 1;
      puVar8 = puVar8 + 4;
      uVar18 = (ulong)(uint)numnodes;
      puVar10 = puVar10 + 4;
      paVar14 = (anon_union_32_2_9298864e_for_node_t_4 *)((long)local_40 + 0x48);
    }
  }
  bVar17 = true;
LAB_004066e0:
  puVar8 = local_38;
  *(undefined8 *)(__s + -8) = 0x4066e9;
  operator_delete__(puVar8);
  return bVar17;
LAB_004066dd:
  bVar17 = false;
  goto LAB_004066e0;
}

Assistant:

static bool LoadNodes (FileReader * lump)
{
	const int NF_SUBSECTOR = 0x8000;
	const int GL5_NF_SUBSECTOR = (1 << 31);

	int 		i;
	int 		j;
	int 		k;
	node_t* 	no;
	WORD*		used;

	if (!format5)
	{
		mapnode_t*	mn, * basemn;
		numnodes = lump->GetLength() / sizeof(mapnode_t);

		if (numnodes == 0) return false;

		nodes = new node_t[numnodes];		
		lump->Seek(0, SEEK_SET);

		basemn = mn = new mapnode_t[numnodes];
		lump->Read(mn, lump->GetLength());

		used = (WORD *)alloca (sizeof(WORD)*numnodes);
		memset (used, 0, sizeof(WORD)*numnodes);

		no = nodes;

		for (i = 0; i < numnodes; i++, no++, mn++)
		{
			no->x = LittleShort(mn->x)<<FRACBITS;
			no->y = LittleShort(mn->y)<<FRACBITS;
			no->dx = LittleShort(mn->dx)<<FRACBITS;
			no->dy = LittleShort(mn->dy)<<FRACBITS;
			for (j = 0; j < 2; j++)
			{
				WORD child = LittleShort(mn->children[j]);
				if (child & NF_SUBSECTOR)
				{
					child &= ~NF_SUBSECTOR;
					if (child >= numsubsectors)
					{
						delete [] basemn;
						return false;
					}
					no->children[j] = (BYTE *)&subsectors[child] + 1;
				}
				else if (child >= numnodes)
				{
					delete [] basemn;
					return false;
				}
				else if (used[child])
				{
					delete [] basemn;
					return false;
				}
				else
				{
					no->children[j] = &nodes[child];
					used[child] = j + 1;
				}
				for (k = 0; k < 4; k++)
				{
					no->bbox[j][k] = (float)LittleShort(mn->bbox[j][k]);
				}
			}
		}
		delete [] basemn;
	}
	else
	{
		gl5_mapnode_t*	mn, * basemn;
		numnodes = lump->GetLength() / sizeof(gl5_mapnode_t);

		if (numnodes == 0) return false;

		nodes = new node_t[numnodes];		
		lump->Seek(0, SEEK_SET);

		basemn = mn = new gl5_mapnode_t[numnodes];
		lump->Read(mn, lump->GetLength());

		used = (WORD *)alloca (sizeof(WORD)*numnodes);
		memset (used, 0, sizeof(WORD)*numnodes);

		no = nodes;

		for (i = 0; i < numnodes; i++, no++, mn++)
		{
			no->x = LittleShort(mn->x)<<FRACBITS;
			no->y = LittleShort(mn->y)<<FRACBITS;
			no->dx = LittleShort(mn->dx)<<FRACBITS;
			no->dy = LittleShort(mn->dy)<<FRACBITS;
			for (j = 0; j < 2; j++)
			{
				SDWORD child = LittleLong(mn->children[j]);
				if (child & GL5_NF_SUBSECTOR)
				{
					child &= ~GL5_NF_SUBSECTOR;
					if (child >= numsubsectors)
					{
						delete [] basemn;
						return false;
					}
					no->children[j] = (BYTE *)&subsectors[child] + 1;
				}
				else if (child >= numnodes)
				{
					delete [] basemn;
					return false;
				}
				else if (used[child])
				{
					delete [] basemn;
					return false;
				}
				else
				{
					no->children[j] = &nodes[child];
					used[child] = j + 1;
				}
				for (k = 0; k < 4; k++)
				{
					no->bbox[j][k] = (float)LittleShort(mn->bbox[j][k]);
				}
			}
		}
		delete [] basemn;
	}
	return true;
}